

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O0

void __thiscall hnsw::HNSWIndex::LoadIndex(HNSWIndex *this,char *filename)

{
  undefined1 auVar1 [16];
  bool bVar2;
  _Ios_Openmode _Var3;
  reference pvVar4;
  reference pvVar5;
  uint *in_RSI;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *in_RDI;
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  int i_1;
  index_t edge;
  uint32_t j;
  index_t num_neighbors;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *neighbors;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *__range3;
  layer_t layer;
  index_t idx;
  uint32_t i;
  size_t out_degrees;
  size_t num_layers;
  int layers [32];
  ifstream is;
  vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *this_00;
  uint *__args;
  char *this_01;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  uint uVar10;
  undefined4 in_stack_fffffffffffffd08;
  uint in_stack_fffffffffffffd0c;
  uint in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd14;
  __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
  local_2d8;
  reference local_2d0;
  int local_2c4;
  uint local_2c0;
  uint local_2bc;
  long local_2b8;
  long local_2b0;
  uint local_2a8 [36];
  char local_218 [520];
  uint *local_10;
  undefined1 extraout_var [56];
  undefined1 auVar7 [16];
  undefined1 extraout_var_00 [56];
  
  local_10 = in_RSI;
  printf("Loading index from %s\n",in_RSI);
  _Var3 = std::operator|(_S_bin,_S_in);
  this_01 = local_218;
  std::ifstream::ifstream(this_01,(char *)local_10,_Var3);
  std::istream::read(this_01,(long)&in_RDI[7].
                                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::resize
            ((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),(size_type)this_01);
  memset(local_2a8,0,0x80);
  local_2b0 = 0;
  local_2b8 = 0;
  *(undefined4 *)
   &in_RDI[1].
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].
           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  __args = local_10;
  for (local_2bc = 0;
      local_2bc <
      *(uint *)&in_RDI[7].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; local_2bc = local_2bc + 1) {
    std::istream::read(local_218,(long)&local_2c0);
    pvVar4 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
             operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *
                        )(in_RDI + 2),(ulong)local_2c0);
    std::istream::read(local_218,(long)&pvVar4->layer);
    this_00 = (vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *)
              (in_RDI + 2);
    pvVar4 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
             operator[](this_00,(ulong)local_2c0);
    std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::operator[]
              (this_00,(ulong)local_2c0);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::resize((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),(size_type)this_01);
    pvVar5 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
             operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *
                        )(in_RDI + 2),(ulong)local_2c0);
    local_2b0 = (pvVar5->layer + 1) + local_2b0;
    local_2c4 = 0;
    local_2d0 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
                operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                            *)(in_RDI + 2),(ulong)local_2c0);
    local_2d8._M_current =
         (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
         )std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::begin((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   *)this_00);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::end((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           *)this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                          *)pvVar4,
                         (__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                          *)this_00);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
      ::operator*(&local_2d8);
      std::istream::read(local_218,(long)&stack0xfffffffffffffd14);
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      for (in_stack_fffffffffffffd10 = 0; in_stack_fffffffffffffd10 < in_stack_fffffffffffffd14;
          in_stack_fffffffffffffd10 = in_stack_fffffffffffffd10 + 1) {
        std::istream::read(local_218,(long)&stack0xfffffffffffffd0c);
        in_stack_fffffffffffffd08 = 0;
        std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
        emplace_back<unsigned_int&,float>(in_RDI,__args,(float *)pvVar4);
        if (*(uint *)&in_RDI[7].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish <= in_stack_fffffffffffffd0c) {
          printf("Data corrupted\n");
        }
      }
      local_2b8 = (ulong)in_stack_fffffffffffffd14 + local_2b8;
      local_2a8[local_2c4] = local_2a8[local_2c4] + 1;
      local_2c4 = local_2c4 + 1;
      __gnu_cxx::
      __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
      ::operator++(&local_2d8);
    }
    pvVar4 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
             operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *
                        )(in_RDI + 2),(ulong)local_2c0);
    if (*(int *)((long)&in_RDI[1].
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) < pvVar4->layer) {
      pvVar4 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
               operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                           *)(in_RDI + 2),(ulong)local_2c0);
      *(layer_t *)
       ((long)&in_RDI[1].
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = pvVar4->layer;
      *(uint *)&in_RDI[1].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2c0;
    }
  }
  auVar9 = std::ifstream::close();
  auVar8._0_8_ = auVar9._8_8_;
  auVar6._0_8_ = auVar9._0_8_;
  auVar8._8_56_ = extraout_var_00;
  auVar7 = auVar8._0_16_;
  auVar6._8_56_ = extraout_var;
  auVar9 = auVar6._0_16_;
  printf("Loaded %u points into index\n",
         (ulong)*(uint *)&in_RDI[7].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  auVar1 = vcvtusi2sd_avx512f(auVar9,local_2b8);
  auVar9 = vcvtusi2sd_avx512f(auVar7,*(undefined4 *)
                                      &in_RDI[7].
                                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
  printf("Total layers: %lu, avg out degrees: %f\n",auVar1._0_8_ / auVar9._0_8_,local_2b0);
  for (uVar10 = 0;
      (int)uVar10 <=
      *(int *)((long)&in_RDI[1].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4); uVar10 = uVar10 + 1)
  {
    printf("Layer %d: %d\n",(ulong)uVar10,(ulong)local_2a8[(int)uVar10]);
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void LoadIndex(const char *filename) {
    printf("Loading index from %s\n", filename);

    std::ifstream is(filename, std::ios::binary | std::ios::in);
    is.read((char *)&num_points_, sizeof(index_t));
    vertices_.resize(num_points_);

    int layers[32];
    memset(layers, 0, sizeof(layers));
    size_t num_layers = 0, out_degrees = 0;

    ep_ = 0;
    top_layer_ = 0;
    for (uint32_t i = 0; i < num_points_; i++) {
      index_t idx;
      is.read((char *)&idx, sizeof(index_t));
      is.read((char *)&vertices_[idx].layer, sizeof(layer_t));
      vertices_[idx].neighbors.resize(vertices_[idx].layer + 1);

      num_layers += vertices_[idx].layer + 1;

      layer_t layer = 0;
      for (auto &neighbors : vertices_[idx].neighbors) {
        index_t num_neighbors;
        is.read((char *)&num_neighbors, sizeof(index_t));
        neighbors.reserve(num_neighbors);
        for (uint32_t j = 0; j < num_neighbors; j++) {
          index_t edge;
          is.read((char *)&edge, sizeof(index_t));
          neighbors.emplace_back(edge, 0.0f);
          if (edge >= num_points_) {
            printf("Data corrupted\n");
          }
        }
        // is.read((char *)neighbors.data(), sizeof(Point) * num_neighbors);
        out_degrees += num_neighbors;
        layers[layer++] += 1;
      }

      if (vertices_[idx].layer > top_layer_) {
        top_layer_ = vertices_[idx].layer;
        ep_ = idx;
      }
    }
    is.close();
    printf("Loaded %u points into index\n", num_points_);
    printf("Total layers: %lu, avg out degrees: %f\n", num_layers, 1.0 * out_degrees / num_points_);
    for (int i = 0; i <= top_layer_; i++) {
      printf("Layer %d: %d\n", i, layers[i]);
    }
  }